

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void ppc_POWER5P_cpu_family_class_init(CPUClass *oc,void *data)

{
  oc[1].cpu_exec_interrupt = init_proc_power5plus;
  oc[1].adjust_watchpoint_address = check_pow_970;
  oc[1].get_memory_mapping =
       (_func_void_CPUState_ptr_MemoryMappingList_ptr_conflict *)0x600fe0dd2221;
  oc[1].set_pc = (_func_void_CPUState_ptr_vaddr_conflict *)0x10000;
  oc[1].synchronize_from_tb =
       (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x800000000204ff36;
  oc[1].tlb_fill =
       (_func__Bool_CPUState_ptr_vaddr_int_MMUAccessType_int__Bool_uintptr_t_conflict *)0x3e00000f;
  oc[1].tcg_initialize = ppc_hash64_handle_mmu_fault;
  oc[1].debug_excp_handler = (_func_void_CPUState_ptr_conflict *)&ppc_hash64_opts_basic;
  *(undefined4 *)&oc[1].cpu_exec_exit = 0x20;
  oc[1].get_phys_page_debug = (_func_hwaddr_CPUState_ptr_vaddr_conflict *)0xd00010002;
  oc[1].get_phys_page_attrs_debug =
       (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x2049200000004;
  *(undefined8 *)((long)&oc[1].asidx_from_attrs + 4) = 0x1000000008000;
  return;
}

Assistant:

POWERPC_FAMILY(POWER5P)(CPUClass *oc, void *data)
{
    PowerPCCPUClass *pcc = POWERPC_CPU_CLASS(oc);

//    dc->fw_name = "PowerPC,POWER5";
//    dc->desc = "POWER5+";
    pcc->init_proc = init_proc_power5plus;
    pcc->check_pow = check_pow_970;
    pcc->insns_flags = PPC_INSNS_BASE | PPC_STRING | PPC_MFTB |
                       PPC_FLOAT | PPC_FLOAT_FSEL | PPC_FLOAT_FRES |
                       PPC_FLOAT_FSQRT | PPC_FLOAT_FRSQRTE |
                       PPC_FLOAT_STFIWX |
                       PPC_CACHE | PPC_CACHE_ICBI | PPC_CACHE_DCBZ |
                       PPC_MEM_SYNC | PPC_MEM_EIEIO |
                       PPC_MEM_TLBIE | PPC_MEM_TLBSYNC |
                       PPC_64B |
                       PPC_SEGMENT_64B | PPC_SLBI;
    pcc->insns_flags2 = PPC2_FP_CVT_S64;
    pcc->msr_mask = (1ull << MSR_SF) |
                    (1ull << MSR_VR) |
                    (1ull << MSR_POW) |
                    (1ull << MSR_EE) |
                    (1ull << MSR_PR) |
                    (1ull << MSR_FP) |
                    (1ull << MSR_ME) |
                    (1ull << MSR_FE0) |
                    (1ull << MSR_SE) |
                    (1ull << MSR_DE) |
                    (1ull << MSR_FE1) |
                    (1ull << MSR_IR) |
                    (1ull << MSR_DR) |
                    (1ull << MSR_PMM) |
                    (1ull << MSR_RI);
    pcc->lpcr_mask = LPCR_RMLS | LPCR_ILE | LPCR_LPES0 | LPCR_LPES1 |
        LPCR_RMI | LPCR_HDICE;
    pcc->mmu_model = POWERPC_MMU_2_03;
    pcc->handle_mmu_fault = ppc_hash64_handle_mmu_fault;
    pcc->hash64_opts = &ppc_hash64_opts_basic;
    pcc->lrg_decr_bits = 32;
    pcc->excp_model = POWERPC_EXCP_970;
    pcc->bus_model = PPC_FLAGS_INPUT_970;
    pcc->flags = POWERPC_FLAG_VRE | POWERPC_FLAG_SE |
                 POWERPC_FLAG_BE | POWERPC_FLAG_PMM |
                 POWERPC_FLAG_BUS_CLK;
    pcc->l1_dcache_size = 0x8000;
    pcc->l1_icache_size = 0x10000;
}